

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpTransfer.cpp
# Opt level: O3

void __thiscall
CFtpTransfer::CFtpTransfer(CFtpTransfer *this,string *ip,int port,int max_connection)

{
  pointer pcVar1;
  bool bVar2;
  string local_48;
  
  pcVar1 = (ip->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + ip->_M_string_length);
  CTransfer::CTransfer(&this->super_CTransfer,&local_48,port);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_CTransfer)._vptr_CTransfer = (_func_int **)&PTR_Accept_0012b598;
  CManageClient::CManageClient(&this->m_ClientManager);
  this->m_MaxConnections = max_connection;
  this->m_CurrentConnetions = 0;
  bVar2 = CManageClient::LoadConfig(&this->m_ClientManager);
  if (bVar2) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Can not find the deny_ip config file,program would exit",0x37);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  exit(-1);
}

Assistant:

CFtpTransfer::CFtpTransfer(const string ip,const int port,const int max_connection)
        :CTransfer(ip,port),m_CurrentConnetions(0),m_MaxConnections(max_connection){
    if(!m_ClientManager.LoadConfig()){
        cout << "Can not find the deny_ip config file,program would exit" << endl;
        exit(-1);
    }
}